

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiowrt.c
# Opt level: O0

void fiowrt(mcmcxdef *mctx,voccxdef *vctx,tokcxdef *tokctx,tokthdef *tab,uchar *fmts,uint fmtl,
           char *fname,uint flags,objnum preinit,int extc,uint prpcnt,char *filever)

{
  undefined8 *in_RSI;
  char *in_stack_00000008;
  errdef fr_;
  osfildef *fp;
  uint in_stack_0000141c;
  uchar *in_stack_00001420;
  tokthdef *in_stack_00001428;
  tokcxdef *in_stack_00001430;
  voccxdef *in_stack_00001438;
  mcmcxdef *in_stack_00001440;
  osfildef *in_stack_00001450;
  uint in_stack_00001458;
  objnum in_stack_00001460;
  int in_stack_00001468;
  uint in_stack_00001470;
  char *in_stack_00001478;
  errdef *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined8 local_188;
  int local_180;
  __jmp_buf_tag _Stack_118;
  FILE *local_50;
  undefined8 *local_28;
  
  local_28 = in_RSI;
  local_50 = fopen(in_stack_00000008,"w+b");
  if (local_50 == (FILE *)0x0) {
    errsigf((errcxdef *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
            (char *)in_stack_fffffffffffffe48,0);
  }
  local_180 = _setjmp(&_Stack_118);
  if (local_180 == 0) {
    local_188 = *(undefined8 *)*local_28;
    *(undefined8 **)*local_28 = &local_188;
    fiowrt1(in_stack_00001440,in_stack_00001438,in_stack_00001430,in_stack_00001428,
            in_stack_00001420,in_stack_0000141c,in_stack_00001450,in_stack_00001458,
            in_stack_00001460,in_stack_00001468,in_stack_00001470,in_stack_00001478);
    os_settype(in_stack_00000008,0);
    *(undefined8 *)*local_28 = local_188;
    return;
  }
  *(undefined8 *)*local_28 = local_188;
  fclose(local_50);
  errrse1((errcxdef *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
          in_stack_fffffffffffffe48);
}

Assistant:

void fiowrt(mcmcxdef *mctx, voccxdef *vctx, tokcxdef *tokctx, tokthdef *tab,
            uchar *fmts, uint fmtl, char *fname, uint flags, objnum preinit,
            int extc, uint prpcnt, char *filever)
{
    osfildef *fp;
    
    /* open the file */
    if (!(fp = osfoprwtb(fname, OSFTGAME)))
        errsig(vctx->voccxerr, ERR_OPWGAM);
    
    ERRBEGIN(vctx->voccxerr)
    
    /* write the file */
    fiowrt1(mctx, vctx, tokctx, tab, fmts, fmtl, fp, flags, preinit,
            extc, prpcnt, filever);
    os_settype(fname, OSFTGAME);
   
    ERRCLEAN(vctx->voccxerr)
        /* clean up by closing the file */
        osfcls(fp);
    ERRENDCLN(vctx->voccxerr)
}